

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O2

ostream * vk::operator<<(ostream *str,AllocationCallbackViolation *violation)

{
  ostream *poVar1;
  Hex<8UL> hex;
  char *pcVar2;
  
  poVar1 = str;
  switch(violation->reason) {
  case REASON_DOUBLE_FREE:
    poVar1 = std::operator<<(str,"Double free of ");
    tcu::Format::operator<<(poVar1,(Hex<16UL>)(violation->record).data.free.mem);
    return str;
  case REASON_FREE_NOT_ALLOCATED_PTR:
    pcVar2 = "Attempt to free ";
    goto LAB_008a9c2a;
  case REASON_REALLOC_NOT_ALLOCATED_PTR:
    pcVar2 = "Attempt to reallocate ";
LAB_008a9c2a:
    poVar1 = std::operator<<(str,pcVar2);
    poVar1 = tcu::Format::operator<<(poVar1,(Hex<16UL>)(violation->record).data.free.mem);
    pcVar2 = " which has not been allocated";
    break;
  case REASON_REALLOC_FREED_PTR:
    poVar1 = std::operator<<(str,"Attempt to reallocate ");
    poVar1 = tcu::Format::operator<<(poVar1,(Hex<16UL>)(violation->record).data.free.mem);
    pcVar2 = " which has been freed";
    break;
  case REASON_NEGATIVE_INTERNAL_ALLOCATION_TOTAL:
    poVar1 = std::operator<<(str,"Internal allocation total for (");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,(violation->record).data.internalAllocation.type);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,(violation->record).data.internalAllocation.scope);
    pcVar2 = ") is negative";
    break;
  case REASON_INVALID_ALLOCATION_SCOPE:
    pcVar2 = "Invalid allocation scope";
    break;
  case REASON_INVALID_INTERNAL_ALLOCATION_TYPE:
    poVar1 = std::operator<<(str,"Invalid internal allocation type ");
    hex.value._4_4_ = 0;
    hex.value._0_4_ = (violation->record).data.internalAllocation.type;
    tcu::Format::operator<<(poVar1,hex);
    return str;
  case REASON_INVALID_ALIGNMENT:
    pcVar2 = "Invalid alignment";
    break;
  case REASON_REALLOC_DIFFERENT_ALIGNMENT:
    pcVar2 = "Reallocation with different alignment";
    break;
  default:
    goto switchD_008a9b8c_default;
  }
  std::operator<<(poVar1,pcVar2);
switchD_008a9b8c_default:
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const AllocationCallbackViolation& violation)
{
	switch (violation.reason)
	{
		case AllocationCallbackViolation::REASON_DOUBLE_FREE:
		{
			DE_ASSERT(violation.record.type == AllocationCallbackRecord::TYPE_FREE);
			str << "Double free of " << tcu::toHex(violation.record.data.free.mem);
			break;
		}

		case AllocationCallbackViolation::REASON_FREE_NOT_ALLOCATED_PTR:
		{
			DE_ASSERT(violation.record.type == AllocationCallbackRecord::TYPE_FREE);
			str << "Attempt to free " << tcu::toHex(violation.record.data.free.mem) << " which has not been allocated";
			break;
		}

		case AllocationCallbackViolation::REASON_REALLOC_NOT_ALLOCATED_PTR:
		{
			DE_ASSERT(violation.record.type == AllocationCallbackRecord::TYPE_REALLOCATION);
			str << "Attempt to reallocate " << tcu::toHex(violation.record.data.reallocation.original) << " which has not been allocated";
			break;
		}

		case AllocationCallbackViolation::REASON_REALLOC_FREED_PTR:
		{
			DE_ASSERT(violation.record.type == AllocationCallbackRecord::TYPE_REALLOCATION);
			str << "Attempt to reallocate " << tcu::toHex(violation.record.data.reallocation.original) << " which has been freed";
			break;
		}

		case AllocationCallbackViolation::REASON_NEGATIVE_INTERNAL_ALLOCATION_TOTAL:
		{
			DE_ASSERT(violation.record.type == AllocationCallbackRecord::TYPE_INTERNAL_FREE);
			str << "Internal allocation total for (" << violation.record.data.internalAllocation.type << ", " << violation.record.data.internalAllocation.scope << ") is negative";
			break;
		}

		case AllocationCallbackViolation::REASON_INVALID_INTERNAL_ALLOCATION_TYPE:
		{
			DE_ASSERT(violation.record.type == AllocationCallbackRecord::TYPE_INTERNAL_ALLOCATION ||
					  violation.record.type == AllocationCallbackRecord::TYPE_INTERNAL_FREE);
			str << "Invalid internal allocation type " << tcu::toHex(violation.record.data.internalAllocation.type);
			break;
		}

		case AllocationCallbackViolation::REASON_INVALID_ALLOCATION_SCOPE:
		{
			str << "Invalid allocation scope";
			break;
		}

		case AllocationCallbackViolation::REASON_INVALID_ALIGNMENT:
		{
			str << "Invalid alignment";
			break;
		}

		case AllocationCallbackViolation::REASON_REALLOC_DIFFERENT_ALIGNMENT:
		{
			str << "Reallocation with different alignment";
			break;
		}

		default:
			DE_ASSERT(false);
	}

	return str;
}